

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawBuffersIndexedTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_0::genRenderbuffers
               (Functions *gl,
               vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
               *drawBuffers,Framebuffer *framebuffer,RenderbufferVector *renderbuffers,
               vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_> *refRenderbuffers)

{
  glBindFramebufferFunc p_Var1;
  glBindRenderbufferFunc p_Var2;
  glRenderbufferStorageFunc p_Var3;
  glFramebufferRenderbufferFunc p_Var4;
  glDrawBuffersFunc p_Var5;
  deUint32 dVar6;
  value_type vVar7;
  int iVar8;
  int iVar9;
  GLenum GVar10;
  size_type sVar11;
  reference pvVar12;
  TextureFormat *pTVar13;
  reference pvVar14;
  const_reference this;
  TextureFormat *format_1;
  DrawBufferInfo *drawBuffer_1;
  int renderbufferNdx_1;
  TextureFormat local_80;
  deUint32 local_74;
  IVec2 *pIStack_70;
  deUint32 glFormat;
  IVec2 *size;
  TextureFormat *format;
  DrawBufferInfo *drawBuffer;
  int renderbufferNdx;
  undefined1 local_48 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> bufs;
  vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_> *refRenderbuffers_local;
  RenderbufferVector *renderbuffers_local;
  Framebuffer *framebuffer_local;
  vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
  *drawBuffers_local;
  Functions *gl_local;
  
  bufs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)refRenderbuffers;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48);
  sVar11 = std::
           vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
           ::size(drawBuffers);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48,sVar11);
  p_Var1 = gl->bindFramebuffer;
  dVar6 = glu::ObjectWrapper::operator*(&framebuffer->super_ObjectWrapper);
  (*p_Var1)(0x8d40,dVar6);
  drawBuffer._0_4_ = 0;
  while( true ) {
    iVar8 = (int)drawBuffer;
    sVar11 = std::
             vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
             ::size(drawBuffers);
    if ((int)sVar11 <= iVar8) break;
    format = (TextureFormat *)
             std::
             vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
             ::operator[](drawBuffers,(long)(int)drawBuffer);
    size = (IVec2 *)DrawBufferInfo::getFormat((DrawBufferInfo *)format);
    pIStack_70 = DrawBufferInfo::getSize((DrawBufferInfo *)format);
    local_80 = *(TextureFormat *)size->m_data;
    local_74 = glu::getInternalFormat(local_80);
    vVar7 = (int)drawBuffer + 0x8ce0;
    pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48,
                         (long)(int)drawBuffer);
    *pvVar12 = vVar7;
    pTVar13 = DrawBufferInfo::getFormat((DrawBufferInfo *)format);
    iVar8 = tcu::Vector<int,_2>::x(pIStack_70);
    iVar9 = tcu::Vector<int,_2>::y(pIStack_70);
    tcu::TextureLevel::TextureLevel((TextureLevel *)&stack0xffffffffffffff58,pTVar13,iVar8,iVar9,1);
    pvVar14 = std::vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>::operator[]
                        ((vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_> *)
                         bufs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,(long)(int)drawBuffer);
    tcu::TextureLevel::operator=(pvVar14,(TextureLevel *)&stack0xffffffffffffff58);
    tcu::TextureLevel::~TextureLevel((TextureLevel *)&stack0xffffffffffffff58);
    p_Var2 = gl->bindRenderbuffer;
    dVar6 = glu::ObjectVector::operator[](&renderbuffers->super_ObjectVector,(long)(int)drawBuffer);
    (*p_Var2)(0x8d41,dVar6);
    dVar6 = local_74;
    p_Var3 = gl->renderbufferStorage;
    iVar8 = tcu::Vector<int,_2>::x(pIStack_70);
    iVar9 = tcu::Vector<int,_2>::y(pIStack_70);
    (*p_Var3)(0x8d41,dVar6,iVar8,iVar9);
    p_Var4 = gl->framebufferRenderbuffer;
    GVar10 = (int)drawBuffer + 0x8ce0;
    dVar6 = glu::ObjectVector::operator[](&renderbuffers->super_ObjectVector,(long)(int)drawBuffer);
    (*p_Var4)(0x8d40,GVar10,0x8d41,dVar6);
    GVar10 = (*gl->getError)();
    glu::checkError(GVar10,"Failed to create renderbuffer.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawBuffersIndexedTests.cpp"
                    ,0x1a2);
    drawBuffer._0_4_ = (int)drawBuffer + 1;
  }
  p_Var5 = gl->drawBuffers;
  sVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48);
  pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48,0);
  (*p_Var5)((GLsizei)sVar11,pvVar12);
  drawBuffer_1._4_4_ = 0;
  while( true ) {
    sVar11 = std::
             vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
             ::size(drawBuffers);
    if ((int)sVar11 <= drawBuffer_1._4_4_) break;
    this = std::
           vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
           ::operator[](drawBuffers,(long)drawBuffer_1._4_4_);
    pTVar13 = DrawBufferInfo::getFormat(this);
    sVar11 = std::vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>::size
                       ((vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_> *)
                        bufs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                        .super__Vector_impl_data._M_end_of_storage);
    pvVar14 = std::vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>::operator[]
                        ((vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_> *)
                         bufs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,(long)drawBuffer_1._4_4_)
    ;
    clearRenderbuffer(gl,pTVar13,drawBuffer_1._4_4_,(int)sVar11,pvVar14);
    drawBuffer_1._4_4_ = drawBuffer_1._4_4_ + 1;
  }
  (*gl->bindRenderbuffer)(0x8d41,0);
  (*gl->bindFramebuffer)(0x8d40,0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48);
  return;
}

Assistant:

void genRenderbuffers (const glw::Functions&			gl,
						const vector<DrawBufferInfo>&	drawBuffers,
						const glu::Framebuffer&			framebuffer,
						const glu::RenderbufferVector&	renderbuffers,
						vector<TextureLevel>&			refRenderbuffers)
{
	vector<deUint32> bufs;

	bufs.resize(drawBuffers.size());

	DE_ASSERT(drawBuffers.size() == renderbuffers.size());
	DE_ASSERT(drawBuffers.size() == refRenderbuffers.size());

	gl.bindFramebuffer(GL_FRAMEBUFFER, *framebuffer);

	for (int renderbufferNdx = 0; renderbufferNdx < (int)drawBuffers.size(); renderbufferNdx++)
	{
		const DrawBufferInfo&		drawBuffer	= drawBuffers[renderbufferNdx];
		const TextureFormat&		format		= drawBuffer.getFormat();
		const IVec2&				size		= drawBuffer.getSize();
		const deUint32				glFormat	= glu::getInternalFormat(format);

		bufs[renderbufferNdx]					= GL_COLOR_ATTACHMENT0 + renderbufferNdx;
		refRenderbuffers[renderbufferNdx]		= TextureLevel(drawBuffer.getFormat(), size.x(), size.y());

		gl.bindRenderbuffer(GL_RENDERBUFFER, renderbuffers[renderbufferNdx]);
		gl.renderbufferStorage(GL_RENDERBUFFER, glFormat, size.x(), size.y());
		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0 + renderbufferNdx, GL_RENDERBUFFER, renderbuffers[renderbufferNdx]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to create renderbuffer.");
	}

	gl.drawBuffers((glw::GLsizei)bufs.size(), &(bufs[0]));

	for (int renderbufferNdx = 0; renderbufferNdx < (int)drawBuffers.size(); renderbufferNdx++)
	{
		const DrawBufferInfo&		drawBuffer	= drawBuffers[renderbufferNdx];
		const TextureFormat&		format		= drawBuffer.getFormat();

		clearRenderbuffer(gl, format, renderbufferNdx, (int)refRenderbuffers.size(),  refRenderbuffers[renderbufferNdx]);
	}

	gl.bindRenderbuffer(GL_RENDERBUFFER, 0);
	gl.bindFramebuffer(GL_FRAMEBUFFER, 0);
}